

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

void __thiscall
cmSourceFileLocation::cmSourceFileLocation(cmSourceFileLocation *this,cmMakefile *mf,string *name)

{
  bool bVar1;
  char *pcVar2;
  string local_90;
  string local_70;
  string local_50;
  string *local_20;
  string *name_local;
  cmMakefile *mf_local;
  cmSourceFileLocation *this_local;
  
  this->Makefile = mf;
  local_20 = name;
  name_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  std::__cxx11::string::string((string *)&this->Directory);
  std::__cxx11::string::string((string *)&this->Name);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar2);
  this->AmbiguousDirectory = (bool)(~bVar1 & 1);
  this->AmbiguousExtension = true;
  cmsys::SystemTools::GetFilenamePath(&local_50,local_20);
  std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar2);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&local_70,&this->Directory);
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  cmsys::SystemTools::GetFilenameName(&local_90,local_20);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  UpdateExtension(this,local_20);
  return;
}

Assistant:

cmSourceFileLocation::cmSourceFileLocation(cmMakefile const* mf,
                                           const std::string& name)
  : Makefile(mf)
{
  this->AmbiguousDirectory = !cmSystemTools::FileIsFullPath(name.c_str());
  this->AmbiguousExtension = true;
  this->Directory = cmSystemTools::GetFilenamePath(name);
  if (cmSystemTools::FileIsFullPath(this->Directory.c_str())) {
    this->Directory = cmSystemTools::CollapseFullPath(this->Directory);
  }
  this->Name = cmSystemTools::GetFilenameName(name);
  this->UpdateExtension(name);
}